

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

Integer pnga_pgroup_split_irreg(Integer grp,Integer mycolor)

{
  Integer *list;
  void *x;
  Integer IVar1;
  Integer IVar2;
  Integer IVar3;
  long lVar4;
  long grp_00;
  size_t __size;
  
  __size = GAnproc << 3;
  list = (Integer *)malloc(__size);
  x = malloc(__size);
  if (mycolor < 0) {
    pnga_error("Invalid argument (color < 0)",mycolor);
  }
  grp_00 = (long)GA_Default_Proc_Group;
  pnga_pgroup_set_default(grp);
  IVar1 = pnga_nnodes();
  IVar2 = pnga_nodeid();
  lVar4 = 0;
  IVar3 = IVar1;
  if (IVar1 < 1) {
    IVar3 = lVar4;
  }
  for (; IVar3 != lVar4; lVar4 = lVar4 + 1) {
    *(undefined8 *)((long)x + lVar4 * 8) = 0;
  }
  *(Integer *)((long)x + IVar2 * 8) = mycolor;
  IVar2 = pnga_type_f2c(0x3f2);
  pnga_gop(IVar2,x,IVar1,"+");
  IVar1 = 0;
  for (lVar4 = 0; IVar3 != lVar4; lVar4 = lVar4 + 1) {
    if (*(long *)((long)x + lVar4 * 8) == mycolor) {
      list[IVar1] = lVar4;
      IVar1 = IVar1 + 1;
    }
  }
  IVar3 = pnga_pgroup_create(list,IVar1);
  pnga_pgroup_set_default(grp_00);
  free(list);
  free(x);
  return IVar3;
}

Assistant:

Integer pnga_pgroup_split_irreg(Integer grp, Integer mycolor)
{
  Integer nprocs, me, default_grp, grp_id;
  Integer i, icnt=0;
  Integer *nodes, *color_arr;
  
  
  /* Allocate temporary arrays */
  nodes = (Integer*)malloc(GAnproc*sizeof(Integer));
  color_arr = (Integer*)malloc(GAnproc*sizeof(Integer));

  if(mycolor<0) pnga_error("Invalid argument (color < 0)",mycolor);

  default_grp = pnga_pgroup_get_default();
  pnga_pgroup_set_default(grp);
  nprocs = pnga_nnodes();
  me = pnga_nodeid();

  /* Figure out what procs are in my group */
  for(i=0; i<nprocs; i++) color_arr[i] = 0;
  color_arr[me] = mycolor;
  pnga_gop(pnga_type_f2c(MT_F_INT), color_arr, nprocs, "+");

  for (icnt=0, i=0; i<nprocs; i++) {
     if(color_arr[i] == mycolor) {
        nodes[icnt] = i;
        icnt++;
     }
  }

  grp_id = pnga_pgroup_create(nodes, icnt);

  pnga_pgroup_set_default(default_grp);

  /* Free temporary arrays */
  free(nodes);
  free(color_arr);


  return grp_id;
}